

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetTypeFromSchema(ArrowType *this,DBConfig *config,ArrowSchema *schema)

{
  undefined8 __p;
  bool bVar1;
  pointer this_00;
  string format;
  ArrowSchemaMetadata schema_metadata;
  ArrowExtensionMetadata extension_info;
  ArrowTypeExtension extension;
  undefined1 local_2d0 [16];
  string local_2c0;
  string local_2a0;
  ArrowSchemaMetadata local_280;
  ArrowExtensionMetadata local_240;
  ArrowTypeExtension local_1c0;
  ArrowExtensionMetadata local_120;
  ArrowExtensionMetadata local_a0;
  
  ::std::__cxx11::string::string
            ((string *)(local_2d0 + 0x10),schema->format,(allocator *)&local_1c0);
  ArrowSchemaMetadata::ArrowSchemaMetadata
            ((ArrowSchemaMetadata *)(local_2d0 + 0x50),schema->metadata);
  GetTypeFromFormat(this,config,schema,(string *)(local_2d0 + 0x10));
  bVar1 = ArrowSchemaMetadata::HasExtension((ArrowSchemaMetadata *)(local_2d0 + 0x50));
  if (bVar1) {
    ::std::__cxx11::string::string((string *)(local_2d0 + 0x30),(string *)(local_2d0 + 0x10));
    ArrowSchemaMetadata::GetExtensionInfo
              (&local_240,(ArrowSchemaMetadata *)(local_2d0 + 0x50),(string *)(local_2d0 + 0x30));
    ::std::__cxx11::string::~string((string *)(local_2d0 + 0x30));
    ArrowExtensionMetadata::ArrowExtensionMetadata(&local_a0,&local_240);
    bVar1 = DBConfig::HasArrowExtension(config,&local_a0);
    ArrowExtensionMetadata::~ArrowExtensionMetadata(&local_a0);
    if (bVar1) {
      ArrowExtensionMetadata::ArrowExtensionMetadata(&local_120,&local_240);
      DBConfig::GetArrowExtension(&local_1c0,config,&local_120);
      ArrowExtensionMetadata::~ArrowExtensionMetadata(&local_120);
      ArrowTypeExtension::GetType
                ((ArrowTypeExtension *)local_2d0,(ArrowSchema *)&local_1c0,
                 (ArrowSchemaMetadata *)schema);
      __p = local_2d0._0_8_;
      local_2d0._0_8_ =
           (__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)0x0;
      ::std::__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::reset
                ((__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)this
                 ,(pointer)__p);
      ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)local_2d0
                );
      ArrowTypeExtension::GetTypeExtension((ArrowTypeExtension *)local_2d0);
      this_00 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                            *)this);
      shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator=
                (&this_00->extension_data,
                 (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)local_2d0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d0 + 8));
      ArrowTypeExtension::~ArrowTypeExtension(&local_1c0);
    }
    ArrowExtensionMetadata::~ArrowExtensionMetadata(&local_240);
  }
  ArrowSchemaMetadata::~ArrowSchemaMetadata((ArrowSchemaMetadata *)(local_2d0 + 0x50));
  ::std::__cxx11::string::~string((string *)(local_2d0 + 0x10));
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromSchema(DBConfig &config, ArrowSchema &schema) {
	auto format = string(schema.format);
	// Let's first figure out if this type is an extension type
	ArrowSchemaMetadata schema_metadata(schema.metadata);
	auto arrow_type = GetTypeFromFormat(config, schema, format);
	if (schema_metadata.HasExtension()) {
		auto extension_info = schema_metadata.GetExtensionInfo(string(format));
		if (config.HasArrowExtension(extension_info)) {
			auto extension = config.GetArrowExtension(extension_info);
			arrow_type = extension.GetType(schema, schema_metadata);
			arrow_type->extension_data = extension.GetTypeExtension();
		}
	}

	return arrow_type;
}